

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O1

void __thiscall
duckdb::TupleDataCollection::Build
          (TupleDataCollection *this,TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,
          idx_t append_offset,idx_t append_count)

{
  pointer pTVar1;
  idx_t iVar2;
  TupleDataAllocator *this_00;
  
  pTVar1 = (this->segments).
           super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pTVar1[-1].data_size;
  this_00 = shared_ptr<duckdb::TupleDataAllocator,_true>::operator->(&pTVar1[-1].allocator);
  TupleDataAllocator::Build(this_00,pTVar1 + -1,pin_state,chunk_state,append_offset,append_count);
  this->data_size = this->data_size + (pTVar1[-1].data_size - iVar2);
  this->count = this->count + append_count;
  return;
}

Assistant:

void TupleDataCollection::Build(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                const idx_t append_offset, const idx_t append_count) {
	auto &segment = segments.back();
	const auto size_before = segment.SizeInBytes();
	segment.allocator->Build(segment, pin_state, chunk_state, append_offset, append_count);
	data_size += segment.SizeInBytes() - size_before;
	count += append_count;
	Verify();
}